

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::TypeManager::CreateDecoration
          (TypeManager *this,uint32_t target,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration,bool is_member,
          uint32_t element)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  __node_base_ptr p_Var1;
  const_reference pvVar2;
  __node_base_ptr p_Var3;
  IRContext *pIVar4;
  iterator_template<spvtools::opt::Instruction> *this_00;
  DefUseManager *this_01;
  undefined1 local_238 [16];
  Instruction *inst;
  int local_220;
  Op local_21c;
  IRContext *local_218;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_210
  ;
  value_type local_204;
  _Any_data local_200;
  SmallVector<unsigned_int,_2UL> local_1f0;
  Operand local_1c8;
  __node_base_ptr local_198;
  size_t i;
  iterator local_188;
  __node_base local_180;
  SmallVector<unsigned_int,_2UL> local_178;
  Operand local_150;
  uint32_t local_11c;
  __buckets_ptr local_118;
  size_type local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  uint32_t local_ac;
  iterator local_a8;
  undefined1 local_a0 [48];
  Operand local_70;
  undefined1 local_40 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  uint32_t element_local;
  bool is_member_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration_local;
  uint32_t target_local;
  TypeManager *this_local;
  
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = element;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_member;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40);
  local_a8 = &local_ac;
  local_a0._0_8_ = 1;
  init_list_02._M_len = 1;
  init_list_02._M_array = local_a8;
  local_ac = target;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a0 + 8),init_list_02);
  Operand::Operand(&local_70,SPV_OPERAND_TYPE_ID,(OperandData *)(local_a0 + 8));
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40,
             &local_70);
  Operand::~Operand(&local_70);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a0 + 8));
  if ((ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    local_11c = (uint32_t)
                ops.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_118 = (__buckets_ptr)&local_11c;
    local_110 = 1;
    init_list_01._M_len = 1;
    init_list_01._M_array = (iterator)local_118;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_01);
    Operand::Operand(&local_e0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_108);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40,
               &local_e0);
    Operand::~Operand(&local_e0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](decoration,0);
  i._4_4_ = *pvVar2;
  local_188 = (iterator)((long)&i + 4);
  local_180._M_nxt = (_Hash_node_base *)0x1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_188;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_178,init_list_00);
  Operand::Operand(&local_150,SPV_OPERAND_TYPE_DECORATION,&local_178);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40,
             &local_150);
  Operand::~Operand(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_178);
  local_198 = (__node_base_ptr)0x1;
  while( true ) {
    p_Var1 = local_198;
    p_Var3 = (__node_base_ptr)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(decoration);
    if (p_Var3 <= p_Var1) break;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (decoration,(size_type)local_198);
    local_204 = *pvVar2;
    local_200._M_unused._M_object = &local_204;
    local_200._8_8_ = 1;
    init_list._M_len = 1;
    init_list._M_array = (iterator)local_200._M_unused._0_8_;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1f0,init_list);
    Operand::Operand(&local_1c8,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_1f0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40,
               &local_1c8);
    Operand::~Operand(&local_1c8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1f0);
    local_198 = (__node_base_ptr)((long)&local_198->_M_nxt + 1);
  }
  pIVar4 = context(this);
  local_218 = context(this);
  local_21c = OpDecorate;
  if ((ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    local_21c = OpMemberDecorate;
  }
  local_220 = 0;
  inst._4_4_ = 0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
            ((spvtools *)&local_210,&local_218,&local_21c,&local_220,(int *)((long)&inst + 4),
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40);
  IRContext::AddAnnotationInst(pIVar4,&local_210);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_210);
  context(this);
  IRContext::annotation_end((IRContext *)local_238);
  this_00 = &InstructionList::iterator::operator--((iterator *)local_238)->super_iterator;
  local_238._8_8_ =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<spvtools::opt::Instruction>::operator*(this_00);
  pIVar4 = context(this);
  this_01 = IRContext::get_def_use_mgr(pIVar4);
  DefUseManager::AnalyzeInstUse(this_01,(Instruction *)local_238._8_8_);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40);
  return;
}

Assistant:

void TypeManager::CreateDecoration(uint32_t target,
                                   const std::vector<uint32_t>& decoration,
                                   bool is_member, uint32_t element) {
  std::vector<Operand> ops;
  ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {target}));
  if (is_member) {
    ops.push_back(Operand(SPV_OPERAND_TYPE_LITERAL_INTEGER, {element}));
  }
  ops.push_back(Operand(SPV_OPERAND_TYPE_DECORATION, {decoration[0]}));
  for (size_t i = 1; i < decoration.size(); ++i) {
    ops.push_back(Operand(SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration[i]}));
  }
  context()->AddAnnotationInst(MakeUnique<Instruction>(
      context(), (is_member ? spv::Op::OpMemberDecorate : spv::Op::OpDecorate),
      0, 0, ops));
  Instruction* inst = &*--context()->annotation_end();
  context()->get_def_use_mgr()->AnalyzeInstUse(inst);
}